

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

void __thiscall QRingChunk::detach(QRingChunk *this)

{
  QByteArray *this_00;
  QRingChunk *in_RDI;
  long in_FS_OFFSET;
  qsizetype chunkSize;
  QByteArray *in_stack_ffffffffffffffb8;
  QRingChunk *in_stack_ffffffffffffffc0;
  QByteArray *this_01;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QByteArray *)size(in_RDI);
  data(in_stack_ffffffffffffffc0);
  this_01 = &local_20;
  QByteArray::QByteArray(this_00,(char *)in_RDI,(qsizetype)this_01);
  QByteArray::operator=(this_01,in_stack_ffffffffffffffb8);
  QByteArray::~QByteArray((QByteArray *)0x174999);
  in_RDI->headOffset = 0;
  in_RDI->tailOffset = (qsizetype)this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingChunk::detach()
{
    Q_ASSERT(isShared());

    const qsizetype chunkSize = size();
    chunk = QByteArray(std::as_const(*this).data(), chunkSize);
    headOffset = 0;
    tailOffset = chunkSize;
}